

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentPtr::SetStates(ON_SubDComponentPtr *this,ON_ComponentStatus states_to_set)

{
  Type TVar1;
  uint uVar2;
  ON__UINT_PTR OVar3;
  bool bVar4;
  
  TVar1 = ComponentType(this);
  if (TVar1 == Face) {
    OVar3 = this->m_ptr;
    bVar4 = (~(uint)OVar3 & 6) == 0;
  }
  else if (TVar1 == Edge) {
    OVar3 = this->m_ptr;
    bVar4 = ((uint)OVar3 & 6) == 4;
  }
  else {
    if (TVar1 != Vertex) goto LAB_005cd4fe;
    OVar3 = this->m_ptr;
    bVar4 = ((uint)OVar3 & 6) == 2;
  }
  if ((OVar3 & 0xfffffffffffffff8) != 0 && bVar4) {
    uVar2 = ON_ComponentStatus::SetStates
                      ((ON_ComponentStatus *)((OVar3 & 0xfffffffffffffff8) + 0x10),states_to_set);
    return uVar2;
  }
LAB_005cd4fe:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDComponentPtr::SetStates(
  ON_ComponentStatus states_to_set
  )
{
  switch (ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = Vertex();
      if (nullptr != vertex)
        return vertex->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = Edge();
      if (nullptr != edge)
        return edge->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = Face();
      if (nullptr != face)
        return face->m_status.SetStates(states_to_set);
    }
    break;
  case ON_SubDComponentPtr::Type::Unset:
    break;
  }
  return ON_SUBD_RETURN_ERROR(0);
}